

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int *qubits,real_type theta,bool fixed)

{
  double dVar1;
  
  (this->super_QAdjustable).fixed_ = fixed;
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004cfe98;
  dVar1 = ::cos(theta * 0.5);
  (this->rotation_).angle_.cos_ = dVar1;
  dVar1 = ::sin(theta * 0.5);
  (this->rotation_).angle_.sin_ = dVar1;
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const real_type theta ,
                        const bool fixed = false )
        : rotation_( theta )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }